

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_20de8f::NullBackend::start(NullBackend *this)

{
  _Mem_fn<int_((anonymous_namespace)::NullBackend::*)()> *this_00;
  atomic<bool> *in_RDI;
  exception *e;
  thread *in_stack_ffffffffffffff98;
  memory_order in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  code *__args;
  _Mem_fn<int_((anonymous_namespace)::NullBackend::*)()> *__f;
  
  std::atomic<bool>::store
            (in_RDI,SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0),in_stack_ffffffffffffffa0);
  __args = mixerProc;
  __f = (_Mem_fn<int_((anonymous_namespace)::NullBackend::*)()> *)0x0;
  this_00 = std::mem_fn<int(),(anonymous_namespace)::NullBackend>
                      ((offset_in_NullBackend_to_subr)in_RDI);
  std::thread::
  thread<std::_Mem_fn<int((anonymous_namespace)::NullBackend::*)()>,(anonymous_namespace)::NullBackend*,void>
            ((thread *)this_00,__f,(NullBackend **)__args);
  std::thread::operator=
            ((thread *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  std::thread::~thread((thread *)0x22a191);
  return;
}

Assistant:

void NullBackend::start()
{
    try {
        mKillNow.store(false, std::memory_order_release);
        mThread = std::thread{std::mem_fn(&NullBackend::mixerProc), this};
    }
    catch(std::exception& e) {
        throw al::backend_exception{ALC_INVALID_DEVICE, "Failed to start mixing thread: %s",
            e.what()};
    }
}